

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::MLTIntegrator::L
          (MLTIntegrator *this,ScratchBuffer *scratchBuffer,MLTSampler *sampler,int depth,
          Point2f *pRaster,SampledWavelengths *lambda)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  CameraSample sample;
  ulong uVar2;
  int iVar3;
  Array path;
  ulong uVar4;
  Array path_00;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  TVar5;
  uintptr_t iptr;
  Float FVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [56];
  float fVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [56];
  undefined1 in_register_000012c4 [12];
  Bounds2f BVar20;
  SampledSpectrum SVar21;
  int local_160;
  int local_15c;
  undefined1 local_158 [16];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)> local_f8;
  char local_f0;
  SamplerHandle local_e8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_e0;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_d8;
  uintptr_t local_d0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_c8;
  SamplerHandle local_c0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_b8;
  SamplerHandle local_b0;
  optional<pbrt::CameraRayDifferential> crd;
  undefined1 auVar13 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar18 [64];
  
  uVar16 = in_ZMM1._12_8_;
  MLTSampler::StartStream(sampler,0);
  if (depth == 0) {
    local_15c = 0;
    local_160 = 2;
    fVar15 = 1.0;
  }
  else {
    FVar6 = MLTSampler::Get1D(sampler);
    fVar15 = (float)(depth + 2);
    local_15c = depth + 1;
    if ((int)(FVar6 * fVar15) <= depth + 1) {
      local_15c = (int)(FVar6 * fVar15);
    }
    local_160 = (depth + 2) - local_15c;
  }
  if (*(char *)(Options + 6) == '\x01') {
    FVar6 = 0.5;
  }
  else {
    FVar6 = MLTSampler::Get1D(sampler);
  }
  SampledWavelengths::SampleXYZ((SampledWavelengths *)&crd,FVar6);
  *(anon_struct_8_0_00000001_for___align *)(lambda->lambda).values = crd.optionalValue.__align;
  *(undefined8 *)((lambda->lambda).values + 2) = crd.optionalValue._8_8_;
  *(undefined8 *)(lambda->pdf).values = crd.optionalValue._16_8_;
  *(undefined8 *)((lambda->pdf).values + 2) = crd.optionalValue._24_8_;
  local_158._8_8_ = crd.optionalValue._8_8_;
  path = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_160);
  BVar20 = FilmBase::SampleBounds
                     ((FilmBase *)
                      (*(ulong *)(((this->camera).
                                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                                   .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff));
  local_158._0_4_ = BVar20.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  local_158._4_4_ = BVar20.pMin.super_Tuple2<pbrt::Point2,_float>.y;
  auVar11._0_8_ = MLTSampler::Get2D(sampler);
  auVar11._8_56_ = extraout_var;
  auVar17._8_4_ = 0x3f800000;
  auVar17._0_8_ = 0x3f8000003f800000;
  auVar17._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar17,auVar11._0_16_);
  local_138 = BVar20.pMax.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_134 = BVar20.pMax.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_130 = (float)uVar16;
  fStack_12c = (float)((ulong)uVar16 >> 0x20);
  auVar8._0_4_ = auVar11._0_4_ * local_138;
  auVar8._4_4_ = auVar11._4_4_ * fStack_134;
  auVar8._8_4_ = extraout_var._0_4_ * fStack_130;
  auVar8._12_4_ = extraout_var._4_4_ * fStack_12c;
  auVar17 = vfmadd231ps_fma(auVar8,auVar17,local_158);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar17);
  pRaster->super_Tuple2<pbrt::Point2,_float> = TVar1;
  FVar6 = MLTSampler::Get1D(sampler);
  auVar12._0_8_ = MLTSampler::Get2D(sampler);
  auVar12._8_56_ = extraout_var_00;
  auVar17 = vmovlhps_avx(auVar17,auVar12._0_16_);
  sample.time._0_1_ = SUB41(FVar6,0);
  sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar17._0_8_;
  sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)auVar17._0_8_ >> 0x20);
  sample.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)auVar17._8_8_;
  sample.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)auVar17._8_8_ >> 0x20);
  sample._17_7_ = (int7)(CONCAT44(0x3f800000,FVar6) >> 8);
  CameraHandle::GenerateRayDifferential(&crd,&this->camera,sample,lambda);
  uVar16 = 0;
  if (crd.set == true) {
    if (((float)crd.optionalValue._96_4_ == 0.0) && (!NAN((float)crd.optionalValue._96_4_))) {
      uVar2 = 0;
      do {
        uVar4 = uVar2;
        if (uVar4 == 3) goto LAB_003f8615;
        fVar7 = *(float *)((long)&crd.optionalValue + uVar4 * 4 + 100);
      } while ((fVar7 == 0.0) && (uVar2 = uVar4 + 1, !NAN(fVar7)));
      if (2 < uVar4) goto LAB_003f8615;
    }
    auVar9._0_4_ = (float)sampler->mutationsPerPixel;
    auVar9._4_12_ = in_register_000012c4;
    if (auVar9._0_4_ < 0.0) {
      fVar7 = sqrtf(auVar9._0_4_);
    }
    else {
      auVar17 = vsqrtss_avx(auVar9,auVar9);
      fVar7 = auVar17._0_4_;
    }
    if (crd.set == true) {
      auVar17 = vmaxss_avx(ZEXT416((uint)(1.0 / fVar7)),ZEXT416(0x3e000000));
      RayDifferential::ScaleDifferentials((RayDifferential *)&crd,auVar17._0_4_);
      if (crd.set != false) {
        TVar5.bits = (ulong)sampler | 0x8000000000000;
        local_b8.bits =
             (this->camera).
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_b0.
        super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )TVar5.bits;
        iVar3 = GenerateCameraSubpath
                          (&this->super_Integrator,(RayDifferential *)&crd,lambda,&local_b0,
                           scratchBuffer,local_160,(CameraHandle *)&local_b8,path,this->regularize);
        if (iVar3 == local_160) {
          MLTSampler::StartStream(sampler,1);
          path_00 = ScratchBuffer::Alloc<pbrt::Vertex[]>(scratchBuffer,(long)local_15c);
          local_c8.bits =
               (this->camera).
               super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
               .bits;
          local_d0 = (this->lightSampler).
                     super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                     .bits;
          local_c0.
          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                   )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )TVar5.bits;
          iVar3 = GenerateLightSubpath
                            (&this->super_Integrator,lambda,&local_c0,(CameraHandle *)&local_c8,
                             scratchBuffer,local_15c,(path->field_2).ei.super_Interaction.time,
                             (LightSamplerHandle)&local_d0,path_00,this->regularize);
          auVar10._0_8_ = 0;
          auVar14 = ZEXT856(0);
          uVar16 = 0;
          auVar19 = ZEXT856(0);
          if (iVar3 == local_15c) {
            MLTSampler::StartStream(sampler,2);
            local_f0 = '\0';
            local_d8.bits =
                 (this->lightSampler).
                 super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                 .bits;
            local_e0.bits =
                 (this->camera).
                 super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                 .bits;
            local_e8.
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     )(TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       )TVar5.bits;
            SVar21 = ConnectBDPT(&this->super_Integrator,lambda,path_00,path,local_15c,local_160,
                                 (LightSamplerHandle *)&local_d8,(CameraHandle *)&local_e0,&local_e8
                                 ,(optional<pbrt::Point2<float>_> *)&local_f8.__align,(Float *)0x0);
            auVar18._0_8_ = SVar21.values.values._8_8_;
            auVar18._8_56_ = auVar19;
            auVar13._0_8_ = SVar21.values.values._0_8_;
            auVar13._8_56_ = auVar14;
            auVar17 = vmovlhps_avx(auVar13._0_16_,auVar18._0_16_);
            auVar10._0_8_ = CONCAT44(fVar15 * auVar17._4_4_,fVar15 * auVar17._0_4_);
            auVar10._8_4_ = fVar15 * auVar17._8_4_;
            auVar10._12_4_ = fVar15 * auVar17._12_4_;
            if (local_f0 == '\x01') {
              pRaster->super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)local_f8;
            }
            auVar17 = vshufpd_avx(auVar10,auVar10,1);
            uVar16 = auVar17._0_8_;
          }
        }
        else {
          auVar10._0_8_ = 0;
          uVar16 = 0;
        }
        goto LAB_003f87ea;
      }
    }
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
  }
LAB_003f8615:
  auVar10._0_8_ = 0;
LAB_003f87ea:
  SVar21.values.values[2] = (float)(int)uVar16;
  SVar21.values.values[3] = (float)(int)((ulong)uVar16 >> 0x20);
  SVar21.values.values[0] = (float)(int)auVar10._0_8_;
  SVar21.values.values[1] = (float)(int)((ulong)auVar10._0_8_ >> 0x20);
  return (SampledSpectrum)SVar21.values.values;
}

Assistant:

SampledSpectrum MLTIntegrator::L(ScratchBuffer &scratchBuffer, MLTSampler &sampler,
                                 int depth, Point2f *pRaster,
                                 SampledWavelengths *lambda) {
    sampler.StartStream(cameraStreamIndex);
    // Determine the number of available strategies and pick a specific one
    int s, t, nStrategies;
    if (depth == 0) {
        nStrategies = 1;
        s = 0;
        t = 2;
    } else {
        nStrategies = depth + 2;
        s = std::min<int>(sampler.Get1D() * nStrategies, nStrategies - 1);
        t = nStrategies - s;
    }

    // Sample wavelengths for MLT path
    if (Options->disableWavelengthJitter)
        *lambda = camera.GetFilm().SampleWavelengths(0.5);
    else
        *lambda = camera.GetFilm().SampleWavelengths(sampler.Get1D());

    // Generate a camera subpath with exactly _t_ vertices
    Vertex *cameraVertices = scratchBuffer.Alloc<Vertex[]>(t);
    // Compute camera sample for MLT camera path
    Bounds2f sampleBounds = camera.GetFilm().SampleBounds();
    *pRaster = sampleBounds.Lerp(sampler.Get2D());
    CameraSample cameraSample;
    cameraSample.pFilm = *pRaster;
    cameraSample.time = sampler.Get1D();
    cameraSample.pLens = sampler.Get2D();

    // Generate camera ray for MLT camera path
    pstd::optional<CameraRayDifferential> crd =
        camera.GenerateRayDifferential(cameraSample, *lambda);
    if (!crd || !crd->weight)
        return SampledSpectrum(0.f);
    Float rayDiffScale =
        std::max<Float>(.125, 1 / std::sqrt((Float)sampler.SamplesPerPixel()));
    crd->ray.ScaleDifferentials(rayDiffScale);

    if (GenerateCameraSubpath(*this, crd->ray, *lambda, &sampler, scratchBuffer, t,
                              camera, cameraVertices, regularize) != t)
        return SampledSpectrum(0.f);

    // Generate a light subpath with exactly _s_ vertices
    sampler.StartStream(lightStreamIndex);
    Vertex *lightVertices = scratchBuffer.Alloc<Vertex[]>(s);
    if (GenerateLightSubpath(*this, *lambda, &sampler, camera, scratchBuffer, s,
                             cameraVertices[0].time(), lightSampler, lightVertices,
                             regularize) != s)
        return SampledSpectrum(0.f);

    // Execute connection strategy and return the radiance estimate
    sampler.StartStream(connectionStreamIndex);
    pstd::optional<Point2f> pRasterNew;
    SampledSpectrum L = ConnectBDPT(*this, *lambda, lightVertices, cameraVertices, s, t,
                                    lightSampler, camera, &sampler, &pRasterNew) *
                        nStrategies;
    if (pRasterNew)
        *pRaster = *pRasterNew;
    return L;
}